

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep)

{
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *)this);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,
             &(this->leafHeapBucket).
              super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallNormalWithBarrierHeapBucket);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallFinalizableWithBarrierHeapBucket);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
             &this->finalizableHeapBucket);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::TransferPendingEmptyHeapBlocks(RecyclerSweep& recyclerSweep)
{
    recyclerSweep.TransferPendingEmptyHeapBlocks(&heapBucket);
    recyclerSweep.TransferPendingEmptyHeapBlocks(&leafHeapBucket);
#ifdef RECYCLER_WRITE_BARRIER
    recyclerSweep.TransferPendingEmptyHeapBlocks(&smallNormalWithBarrierHeapBucket);
    recyclerSweep.TransferPendingEmptyHeapBlocks(&smallFinalizableWithBarrierHeapBucket);
#endif
    recyclerSweep.TransferPendingEmptyHeapBlocks(&finalizableHeapBucket);
#ifdef RECYCLER_VISITED_HOST
    recyclerSweep.TransferPendingEmptyHeapBlocks(&recyclerVisitedHostHeapBucket);
#endif
}